

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O2

int nn_rep_create(void *hint,nn_sockbase **sockbase)

{
  nn_rep *self;
  
  self = (nn_rep *)nn_alloc_(0x200);
  if (self != (nn_rep *)0x0) {
    nn_rep_init(self,&nn_rep_sockbase_vfptr,hint);
    *sockbase = (nn_sockbase *)self;
    return 0;
  }
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/reqrep/rep.c"
          ,0x94);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_rep_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_rep *self;

    self = nn_alloc (sizeof (struct nn_rep), "socket (rep)");
    alloc_assert (self);
    nn_rep_init (self, &nn_rep_sockbase_vfptr, hint);
    *sockbase = &self->xrep.sockbase;

    return 0;
}